

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O2

bool __thiscall ImportedFuncWrapper::isByOrdinal(ImportedFuncWrapper *this)

{
  bool bVar1;
  long *plVar2;
  uint64_t *ptr;
  
  plVar2 = (long *)getValuePtr(this,ORIG_FIRST_THUNK);
  if (plVar2 == (long *)0x0) {
    plVar2 = (long *)getValuePtr(this,FIRST_THUNK);
    if (plVar2 != (long *)0x0) goto LAB_00128a4d;
LAB_00128a6c:
    bVar1 = false;
  }
  else {
LAB_00128a4d:
    bVar1 = ExeElementWrapper::isBit64((ExeElementWrapper *)this);
    if (bVar1) {
      if (-1 < *plVar2) goto LAB_00128a6c;
    }
    else if (-1 < (int)*plVar2) goto LAB_00128a6c;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ImportedFuncWrapper::isByOrdinal()
{
    void *p = getValuePtr(ImportEntryWrapper::ORIG_FIRST_THUNK);
    if (!p) p = getValuePtr(ImportEntryWrapper::FIRST_THUNK);
    if (!p) return false;

    if (isBit64()) {
        uint64_t* ptr =  (uint64_t*) p;
        if ((*ptr) & ORDINAL_FLAG64) return true;

    } else {
        uint32_t* ptr =  (uint32_t*) p;
        if ((*ptr) & ORDINAL_FLAG32) return true;
    }
    return false;
}